

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O3

SMBusByte * __thiscall SMBusByte::ToPMBusCommandExtFrame(SMBusByte *this,SMBusByte *sec)

{
  pointer pSVar1;
  undefined1 uVar2;
  undefined6 uVar3;
  undefined1 *in_RDX;
  
  Frame::Frame((Frame *)this);
  this[1].value = '\v';
  pSVar1 = (sec->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(undefined1 *)((long)&pSVar1->sample_begin + 1);
  uVar3 = *(undefined6 *)((long)&pSVar1->sample_begin + 2);
  this->value = *(undefined1 *)&pSVar1->sample_begin;
  this->is_acked = (bool)uVar2;
  *(undefined6 *)&this->field_0x2 = uVar3;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)(*(long *)(in_RDX + 0x10) + -0x20);
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(ulong)CONCAT11(sec->value,*in_RDX);
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this[1].is_acked = sec->is_acked;
  return this;
}

Assistant:

Frame SMBusByte::ToPMBusCommandExtFrame( const SMBusByte& sec ) const
{
    Frame f;

    f.mType = FT_CmdPMBus;
    f.mStartingSampleInclusive = signals.front().sample_begin;
    f.mEndingSampleInclusive = sec.signals.back().sample_end;
    f.mData1 = value;
    f.mData1 <<= 8;
    f.mData1 |= sec.value;
    f.mData2 = 0;
    f.mFlags = 0;
    if( is_acked )
        f.mFlags |= F_IsAcked;

    return f;
}